

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

Fxu_HeapDouble * Fxu_HeapDoubleStart(void)

{
  Fxu_HeapDouble *pFVar1;
  Fxu_Double **ppFVar2;
  
  pFVar1 = (Fxu_HeapDouble *)calloc(1,0x18);
  pFVar1->nItemsAlloc = 10000;
  ppFVar2 = (Fxu_Double **)malloc(0x13888);
  pFVar1->pTree = ppFVar2;
  *ppFVar2 = (Fxu_Double *)0x0;
  return pFVar1;
}

Assistant:

Fxu_HeapDouble * Fxu_HeapDoubleStart()
{
	Fxu_HeapDouble * p;
	p = ABC_ALLOC( Fxu_HeapDouble, 1 );
	memset( p, 0, sizeof(Fxu_HeapDouble) );
	p->nItems      = 0;
	p->nItemsAlloc = 10000;
	p->pTree       = ABC_ALLOC( Fxu_Double *, p->nItemsAlloc + 1 );
	p->pTree[0]    = NULL;
	return p;
}